

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O2

void lvm_debug_d_s(char *ptr,string *str,size_t temp)

{
  char cVar1;
  bool bVar2;
  int o;
  int iVar3;
  int iVar4;
  int iVar5;
  uint data_num;
  int local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string data_adr;
  stringstream ss;
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [88];
  
  if (data_ptr == ptr) {
    puts("DATA:");
  }
  else if (stack_ptr == ptr) {
    printf("STACK:SP--->%08X\n",(ulong)registe_ptr->SP);
  }
  std::__cxx11::string::substr((ulong)&data_adr,(ulong)str);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string((string *)&local_1f8,"",(allocator *)&data_num);
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_1f8);
  data_num = 0;
  std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&data_adr);
  bVar2 = std::operator==(&local_1f8,"0x");
  std::__cxx11::string::~string((string *)&local_1f8);
  if (bVar2) {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
    std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&data_adr);
    std::operator<<((ostream *)&local_1a8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else {
    std::operator<<((ostream *)&local_1a8,(string *)&data_adr);
  }
  std::istream::_M_extract<unsigned_int>((uint *)&ss);
  iVar4 = 0;
  iVar3 = 0;
  while (iVar4 != 3) {
    local_1fc = iVar4;
    printf("%08X\t",(ulong)(data_num + iVar3));
    iVar5 = iVar3 + 0x10;
    for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
      printf("%02X ",(long)ptr[iVar4 + iVar3 + data_num]);
    }
    putchar(0x7c);
    for (; iVar3 < iVar5; iVar3 = iVar3 + 1) {
      cVar1 = ptr[data_num + iVar3];
      iVar4 = 0x2a;
      if ((cVar1 != '\n') && (cVar1 != '\r')) {
        iVar4 = (int)cVar1;
      }
      putchar(iVar4);
    }
    putchar(10);
    iVar3 = iVar5;
    iVar4 = local_1fc + 1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&data_adr);
  return;
}

Assistant:

void lvm_debug_d_s(char * ptr,std::string str,size_t temp) {
	if (ptr == data_ptr)
		printf("DATA:\n");
	else if (ptr == stack_ptr)
		printf("STACK:SP--->%08X\n", registe_ptr->SP);
	std::string data_adr = str.substr(temp + 1);
	std::stringstream ss;
	ss.str("");
	unsigned data_num{ 0 };
	if (data_adr.substr(0, 2) == "0x")//16进制字符串
	{
		ss << std::hex << data_adr.substr(2);
		ss >> data_num;
	}
	else
	{
		ss << data_adr;
		ss >> data_num;
	}
	int m{ 0 };
	for (int i = 0; i < 3; i++)
	{
		printf("%08X	", data_num + m);
		for (int h = 0; h< 16; h++)
		{
			printf("%02X ", (unsigned char *)ptr[data_num + m]);
			++m;
		}
		int p = m - 16;
		putchar('|');
		for (int o = p; o< m; o++)
		{
			if (ptr[data_num + o] == '\x0a' || ptr[data_num + o] == '\x0d') putchar('*');
			else putchar(ptr[data_num + o]);
		}
		printf("\n");
	}
}